

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::HlslParseContext::transferTypeAttributes
          (HlslParseContext *this,TSourceLoc *loc,TAttributes *attributes,TType *type,
          bool allowEntry)

{
  _List_node_base *this_00;
  ulong *puVar1;
  byte *pbVar2;
  undefined1 uVar3;
  undefined2 uVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  undefined4 extraout_var_35;
  undefined4 extraout_var_36;
  undefined4 extraout_var_37;
  undefined4 extraout_var_38;
  undefined4 extraout_var_39;
  undefined4 extraout_var_40;
  undefined4 extraout_var_41;
  undefined4 extraout_var_42;
  undefined4 extraout_var_43;
  undefined4 extraout_var_44;
  undefined4 extraout_var_45;
  undefined4 extraout_var_46;
  undefined4 extraout_var_47;
  undefined4 extraout_var_48;
  undefined4 extraout_var_49;
  char *pcVar8;
  char *pcVar9;
  undefined7 in_register_00000081;
  _func_int **pp_Var10;
  _List_node_header *p_Var11;
  ulong uVar12;
  _List_node_base *p_Var13;
  int value;
  HlslParseContext *local_88;
  TSourceLoc *local_80;
  uint local_74;
  TString builtInString;
  TSourceLoc loc_1;
  
  if ((attributes->
      super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>).
      super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
      _M_impl._M_node._M_size == 0) {
    return;
  }
  uVar12 = CONCAT71(in_register_00000081,allowEntry) & 0xffffffff;
  local_88 = this;
  local_80 = loc;
  builtInString._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
  builtInString._M_string_length = 0;
  builtInString.field_2._M_local_buf[0] = '\0';
  p_Var11 = &(attributes->
             super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>)
             .
             super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
             ._M_impl._M_node;
  p_Var13 = &p_Var11->super__List_node_base;
  builtInString._M_dataplus._M_p = (pointer)&builtInString.field_2;
LAB_0038bbae:
  while( true ) {
    p_Var13 = ((_List_node_base *)&p_Var13->_M_next)->_M_next;
    if ((_List_node_header *)p_Var13 == p_Var11) {
      return;
    }
    if (*(int *)&p_Var13[1]._M_next - 0x14U < 0x38) break;
switchD_0038bbd5_caseD_1b:
    if ((char)uVar12 == '\0') {
      (*(local_88->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                (local_88,local_80,"attribute does not apply to a type","","");
    }
  }
  this_00 = p_Var13 + 1;
  switch(*(int *)&p_Var13[1]._M_next) {
  case 0x14:
    bVar5 = TAttributeArgs::getInt((TAttributeArgs *)this_00,&value,0);
    if (bVar5) {
      local_74 = (uint)uVar12;
      uVar4 = (undefined2)value;
      iVar7 = (*type->_vptr_TType[10])(type);
      *(undefined2 *)(CONCAT44(extraout_var,iVar7) + 0x20) = uVar4;
      uVar12 = (ulong)local_74;
      iVar7 = (*type->_vptr_TType[10])(type);
      puVar1 = (ulong *)(CONCAT44(extraout_var_00,iVar7) + 0x1c);
      *puVar1 = *puVar1 & 0xffffffffffc07fff;
    }
    else {
      (*(local_88->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (local_88,local_80,"needs a literal integer","binding","");
    }
    bVar5 = TAttributeArgs::getInt((TAttributeArgs *)this_00,&value,1);
    iVar7 = value;
    if (bVar5) {
      iVar6 = (*type->_vptr_TType[10])(type);
      *(ulong *)(CONCAT44(extraout_var_49,iVar6) + 0x1c) =
           *(ulong *)(CONCAT44(extraout_var_49,iVar6) + 0x1c) & 0xffffffffffc07fff |
           (ulong)((iVar7 & 0x7fU) << 0xf);
    }
    goto LAB_0038bbae;
  case 0x15:
    bVar5 = TAttributeArgs::getInt((TAttributeArgs *)this_00,&value,0);
    if (bVar5) {
      (local_88->super_TParseContextBase).globalUniformBinding = value;
    }
    else {
      (*(local_88->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (local_88,local_80,"needs a literal integer","global binding","");
    }
    bVar5 = TAttributeArgs::getInt((TAttributeArgs *)this_00,&value,1);
    if (bVar5) {
      (local_88->super_TParseContextBase).globalUniformSet = value;
    }
    goto LAB_0038bbae;
  case 0x16:
    bVar5 = TAttributeArgs::getInt((TAttributeArgs *)this_00,&value,0);
    iVar7 = value;
    if (bVar5) {
      iVar6 = (*type->_vptr_TType[10])(type);
      *(ulong *)(CONCAT44(extraout_var_18,iVar6) + 0x1c) =
           *(ulong *)(CONCAT44(extraout_var_18,iVar6) + 0x1c) & 0xfffffffffffff000 |
           (ulong)(iVar7 & 0xfff);
      goto LAB_0038bbae;
    }
    pp_Var10 = (local_88->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar9 = "needs a literal integer";
    pcVar8 = "location";
    break;
  case 0x17:
    bVar5 = TAttributeArgs::getInt((TAttributeArgs *)this_00,&value,0);
    if (bVar5) {
      uVar3 = (undefined1)value;
      iVar7 = (*type->_vptr_TType[10])(type);
      *(undefined1 *)(CONCAT44(extraout_var_33,iVar7) + 0x28) = uVar3;
      goto LAB_0038bbae;
    }
    pp_Var10 = (local_88->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar9 = "needs a literal integer";
    pcVar8 = "input attachment";
    break;
  case 0x18:
    bVar5 = TAttributeArgs::getString((TAttributeArgs *)this_00,&builtInString,0,false);
    if ((bVar5) && (bVar5 = std::operator==(&builtInString,"PointSize"), bVar5)) {
      iVar7 = (*type->_vptr_TType[10])(type);
      *(ulong *)(CONCAT44(extraout_var_35,iVar7) + 8) =
           *(ulong *)(CONCAT44(extraout_var_35,iVar7) + 8) & 0xffffffffffff007f | 0xf80;
    }
    goto LAB_0038bbae;
  case 0x19:
    iVar7 = (*type->_vptr_TType[10])(type);
    *(undefined1 *)(CONCAT44(extraout_var_21,iVar7) + 0x2d) = 1;
    goto LAB_0038bbae;
  case 0x1a:
    iVar7 = (*type->_vptr_TType[10])(type);
    if ((*(uint *)(CONCAT44(extraout_var_25,iVar7) + 8) & 0x7f) == 2) {
      bVar5 = TAttributeArgs::getInt((TAttributeArgs *)this_00,&value,0);
      if (bVar5) {
        loc_1.name = (TString *)0x0;
        loc_1.string = 0;
        loc_1.line = 0;
        loc_1.column = 0;
        iVar7 = (*type->_vptr_TType[10])(type);
        setSpecConstantId(local_88,&loc_1,(TQualifier *)CONCAT44(extraout_var_26,iVar7),value);
      }
      goto LAB_0038bbae;
    }
    pp_Var10 = (local_88->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar9 = "needs a const type";
    pcVar8 = "constant_id";
    break;
  default:
    goto switchD_0038bbd5_caseD_1b;
  case 0x22:
    iVar7 = (*type->_vptr_TType[10])(type);
    *(undefined1 *)(CONCAT44(extraout_var_27,iVar7) + 0x2c) = 1;
    goto LAB_0038bbae;
  case 0x23:
    iVar7 = (*type->_vptr_TType[10])(type);
    *(undefined1 *)(CONCAT44(extraout_var_38,iVar7) + 0x2c) = 2;
    goto LAB_0038bbae;
  case 0x24:
    iVar7 = (*type->_vptr_TType[10])(type);
    *(undefined1 *)(CONCAT44(extraout_var_37,iVar7) + 0x2c) = 3;
    goto LAB_0038bbae;
  case 0x25:
    iVar7 = (*type->_vptr_TType[10])(type);
    *(undefined1 *)(CONCAT44(extraout_var_11,iVar7) + 0x2c) = 4;
    goto LAB_0038bbae;
  case 0x26:
    iVar7 = (*type->_vptr_TType[10])(type);
    *(undefined1 *)(CONCAT44(extraout_var_22,iVar7) + 0x2c) = 5;
    goto LAB_0038bbae;
  case 0x27:
    iVar7 = (*type->_vptr_TType[10])(type);
    *(undefined1 *)(CONCAT44(extraout_var_16,iVar7) + 0x2c) = 7;
    goto LAB_0038bbae;
  case 0x28:
    iVar7 = (*type->_vptr_TType[10])(type);
    *(undefined1 *)(CONCAT44(extraout_var_08,iVar7) + 0x2c) = 8;
    goto LAB_0038bbae;
  case 0x29:
    iVar7 = (*type->_vptr_TType[10])(type);
    *(undefined1 *)(CONCAT44(extraout_var_29,iVar7) + 0x2c) = 9;
    goto LAB_0038bbae;
  case 0x2a:
    iVar7 = (*type->_vptr_TType[10])(type);
    *(undefined1 *)(CONCAT44(extraout_var_30,iVar7) + 0x2c) = 10;
    goto LAB_0038bbae;
  case 0x2b:
    iVar7 = (*type->_vptr_TType[10])(type);
    *(undefined1 *)(CONCAT44(extraout_var_41,iVar7) + 0x2c) = 0xb;
    goto LAB_0038bbae;
  case 0x2c:
    iVar7 = (*type->_vptr_TType[10])(type);
    *(undefined1 *)(CONCAT44(extraout_var_39,iVar7) + 0x2c) = 0xc;
    goto LAB_0038bbae;
  case 0x2d:
    iVar7 = (*type->_vptr_TType[10])(type);
    *(undefined1 *)(CONCAT44(extraout_var_06,iVar7) + 0x2c) = 0xd;
    goto LAB_0038bbae;
  case 0x2e:
    iVar7 = (*type->_vptr_TType[10])(type);
    *(undefined1 *)(CONCAT44(extraout_var_17,iVar7) + 0x2c) = 0xe;
    goto LAB_0038bbae;
  case 0x2f:
    iVar7 = (*type->_vptr_TType[10])(type);
    *(undefined1 *)(CONCAT44(extraout_var_43,iVar7) + 0x2c) = 0xf;
    goto LAB_0038bbae;
  case 0x30:
    iVar7 = (*type->_vptr_TType[10])(type);
    *(undefined1 *)(CONCAT44(extraout_var_07,iVar7) + 0x2c) = 0x10;
    goto LAB_0038bbae;
  case 0x31:
    iVar7 = (*type->_vptr_TType[10])(type);
    *(undefined1 *)(CONCAT44(extraout_var_15,iVar7) + 0x2c) = 0x11;
    goto LAB_0038bbae;
  case 0x32:
    iVar7 = (*type->_vptr_TType[10])(type);
    *(undefined1 *)(CONCAT44(extraout_var_10,iVar7) + 0x2c) = 0x12;
    goto LAB_0038bbae;
  case 0x33:
    iVar7 = (*type->_vptr_TType[10])(type);
    *(undefined1 *)(CONCAT44(extraout_var_23,iVar7) + 0x2c) = 0x13;
    goto LAB_0038bbae;
  case 0x34:
    iVar7 = (*type->_vptr_TType[10])(type);
    *(undefined1 *)(CONCAT44(extraout_var_09,iVar7) + 0x2c) = 0x14;
    goto LAB_0038bbae;
  case 0x35:
    iVar7 = (*type->_vptr_TType[10])(type);
    *(undefined1 *)(CONCAT44(extraout_var_45,iVar7) + 0x2c) = 0x15;
    goto LAB_0038bbae;
  case 0x36:
    iVar7 = (*type->_vptr_TType[10])(type);
    *(undefined1 *)(CONCAT44(extraout_var_44,iVar7) + 0x2c) = 0x17;
    goto LAB_0038bbae;
  case 0x37:
    iVar7 = (*type->_vptr_TType[10])(type);
    *(undefined1 *)(CONCAT44(extraout_var_13,iVar7) + 0x2c) = 0x18;
    goto LAB_0038bbae;
  case 0x38:
    iVar7 = (*type->_vptr_TType[10])(type);
    *(undefined1 *)(CONCAT44(extraout_var_19,iVar7) + 0x2c) = 0x19;
    goto LAB_0038bbae;
  case 0x39:
    iVar7 = (*type->_vptr_TType[10])(type);
    *(undefined1 *)(CONCAT44(extraout_var_32,iVar7) + 0x2c) = 0x1a;
    goto LAB_0038bbae;
  case 0x3a:
    iVar7 = (*type->_vptr_TType[10])(type);
    *(undefined1 *)(CONCAT44(extraout_var_20,iVar7) + 0x2c) = 0x1c;
    goto LAB_0038bbae;
  case 0x3b:
    iVar7 = (*type->_vptr_TType[10])(type);
    *(undefined1 *)(CONCAT44(extraout_var_47,iVar7) + 0x2c) = 0x1d;
    goto LAB_0038bbae;
  case 0x3c:
    iVar7 = (*type->_vptr_TType[10])(type);
    *(undefined1 *)(CONCAT44(extraout_var_12,iVar7) + 0x2c) = 0x1e;
    goto LAB_0038bbae;
  case 0x3d:
    iVar7 = (*type->_vptr_TType[10])(type);
    *(undefined1 *)(CONCAT44(extraout_var_40,iVar7) + 0x2c) = 0x1f;
    goto LAB_0038bbae;
  case 0x3e:
    iVar7 = (*type->_vptr_TType[10])(type);
    *(undefined1 *)(CONCAT44(extraout_var_46,iVar7) + 0x2c) = 0x20;
    goto LAB_0038bbae;
  case 0x3f:
    iVar7 = (*type->_vptr_TType[10])(type);
    *(undefined1 *)(CONCAT44(extraout_var_04,iVar7) + 0x2c) = 0x23;
    goto LAB_0038bbae;
  case 0x40:
    iVar7 = (*type->_vptr_TType[10])(type);
    *(undefined1 *)(CONCAT44(extraout_var_36,iVar7) + 0x2c) = 0x24;
    goto LAB_0038bbae;
  case 0x41:
    iVar7 = (*type->_vptr_TType[10])(type);
    *(undefined1 *)(CONCAT44(extraout_var_03,iVar7) + 0x2c) = 0x25;
    goto LAB_0038bbae;
  case 0x42:
    iVar7 = (*type->_vptr_TType[10])(type);
    *(undefined1 *)(CONCAT44(extraout_var_02,iVar7) + 0x2c) = 0x26;
    goto LAB_0038bbae;
  case 0x43:
    iVar7 = (*type->_vptr_TType[10])(type);
    *(undefined1 *)(CONCAT44(extraout_var_14,iVar7) + 0x2c) = 0x2a;
    goto LAB_0038bbae;
  case 0x44:
    iVar7 = (*type->_vptr_TType[10])(type);
    *(undefined1 *)(CONCAT44(extraout_var_24,iVar7) + 0x2c) = 0x28;
    goto LAB_0038bbae;
  case 0x45:
    iVar7 = (*type->_vptr_TType[10])(type);
    *(undefined1 *)(CONCAT44(extraout_var_42,iVar7) + 0x2c) = 0x29;
    goto LAB_0038bbae;
  case 0x46:
    iVar7 = (*type->_vptr_TType[10])(type);
    *(undefined1 *)(CONCAT44(extraout_var_01,iVar7) + 0x2c) = 0x2b;
    goto LAB_0038bbae;
  case 0x47:
    iVar7 = (*type->_vptr_TType[10])(type);
    *(undefined1 *)(CONCAT44(extraout_var_05,iVar7) + 0x2c) = 0x2c;
    goto LAB_0038bbae;
  case 0x48:
    iVar7 = (*type->_vptr_TType[10])(type);
    *(undefined1 *)(CONCAT44(extraout_var_28,iVar7) + 0x2c) = 0x2d;
    goto LAB_0038bbae;
  case 0x49:
    iVar7 = (*type->_vptr_TType[10])(type);
    *(undefined1 *)(CONCAT44(extraout_var_34,iVar7) + 0x2c) = 0;
    goto LAB_0038bbae;
  case 0x4a:
    iVar7 = (*type->_vptr_TType[10])(type);
    pbVar2 = (byte *)(CONCAT44(extraout_var_48,iVar7) + 0xd);
    *pbVar2 = *pbVar2 | 0x80;
    goto LAB_0038bbae;
  case 0x4b:
    goto switchD_0038bbd5_caseD_4b;
  }
  (*pp_Var10[0x2d])(local_88,local_80,pcVar9,pcVar8,"");
  goto LAB_0038bbae;
switchD_0038bbd5_caseD_4b:
  iVar7 = (*type->_vptr_TType[10])(type);
  pbVar2 = (byte *)(CONCAT44(extraout_var_31,iVar7) + 0xe);
  *pbVar2 = *pbVar2 | 1;
  goto LAB_0038bbae;
}

Assistant:

void HlslParseContext::transferTypeAttributes(const TSourceLoc& loc, const TAttributes& attributes, TType& type,
    bool allowEntry)
{
    if (attributes.size() == 0)
        return;

    int value;
    TString builtInString;
    for (auto it = attributes.begin(); it != attributes.end(); ++it) {
        switch (it->name) {
        case EatLocation:
            // location
            if (it->getInt(value))
                type.getQualifier().layoutLocation = value;
            else
                error(loc, "needs a literal integer", "location", "");
            break;
        case EatBinding:
            // binding
            if (it->getInt(value)) {
                type.getQualifier().layoutBinding = value;
                type.getQualifier().layoutSet = 0;
            } else
                error(loc, "needs a literal integer", "binding", "");
            // set
            if (it->getInt(value, 1))
                type.getQualifier().layoutSet = value;
            break;
        case EatGlobalBinding:
            // global cbuffer binding
            if (it->getInt(value))
                globalUniformBinding = value;
            else
                error(loc, "needs a literal integer", "global binding", "");
            // global cbuffer set
            if (it->getInt(value, 1))
                globalUniformSet = value;
            break;
        case EatInputAttachment:
            // input attachment
            if (it->getInt(value))
                type.getQualifier().layoutAttachment = value;
            else
                error(loc, "needs a literal integer", "input attachment", "");
            break;
        case EatBuiltIn:
            // PointSize built-in
            if (it->getString(builtInString, 0, false)) {
                if (builtInString == "PointSize")
                    type.getQualifier().builtIn = EbvPointSize;
            }
            break;
        case EatPushConstant:
            // push_constant
            type.getQualifier().layoutPushConstant = true;
            break;
        case EatConstantId:
            // specialization constant
            if (type.getQualifier().storage != EvqConst) {
                error(loc, "needs a const type", "constant_id", "");
                break;
            }
            if (it->getInt(value)) {
                TSourceLoc loc;
                loc.init();
                setSpecConstantId(loc, type.getQualifier(), value);
            }
            break;

        // image formats
        case EatFormatRgba32f:      type.getQualifier().layoutFormat = ElfRgba32f;      break;
        case EatFormatRgba16f:      type.getQualifier().layoutFormat = ElfRgba16f;      break;
        case EatFormatR32f:         type.getQualifier().layoutFormat = ElfR32f;         break;
        case EatFormatRgba8:        type.getQualifier().layoutFormat = ElfRgba8;        break;
        case EatFormatRgba8Snorm:   type.getQualifier().layoutFormat = ElfRgba8Snorm;   break;
        case EatFormatRg32f:        type.getQualifier().layoutFormat = ElfRg32f;        break;
        case EatFormatRg16f:        type.getQualifier().layoutFormat = ElfRg16f;        break;
        case EatFormatR11fG11fB10f: type.getQualifier().layoutFormat = ElfR11fG11fB10f; break;
        case EatFormatR16f:         type.getQualifier().layoutFormat = ElfR16f;         break;
        case EatFormatRgba16:       type.getQualifier().layoutFormat = ElfRgba16;       break;
        case EatFormatRgb10A2:      type.getQualifier().layoutFormat = ElfRgb10A2;      break;
        case EatFormatRg16:         type.getQualifier().layoutFormat = ElfRg16;         break;
        case EatFormatRg8:          type.getQualifier().layoutFormat = ElfRg8;          break;
        case EatFormatR16:          type.getQualifier().layoutFormat = ElfR16;          break;
        case EatFormatR8:           type.getQualifier().layoutFormat = ElfR8;           break;
        case EatFormatRgba16Snorm:  type.getQualifier().layoutFormat = ElfRgba16Snorm;  break;
        case EatFormatRg16Snorm:    type.getQualifier().layoutFormat = ElfRg16Snorm;    break;
        case EatFormatRg8Snorm:     type.getQualifier().layoutFormat = ElfRg8Snorm;     break;
        case EatFormatR16Snorm:     type.getQualifier().layoutFormat = ElfR16Snorm;     break;
        case EatFormatR8Snorm:      type.getQualifier().layoutFormat = ElfR8Snorm;      break;
        case EatFormatRgba32i:      type.getQualifier().layoutFormat = ElfRgba32i;      break;
        case EatFormatRgba16i:      type.getQualifier().layoutFormat = ElfRgba16i;      break;
        case EatFormatRgba8i:       type.getQualifier().layoutFormat = ElfRgba8i;       break;
        case EatFormatR32i:         type.getQualifier().layoutFormat = ElfR32i;         break;
        case EatFormatRg32i:        type.getQualifier().layoutFormat = ElfRg32i;        break;
        case EatFormatRg16i:        type.getQualifier().layoutFormat = ElfRg16i;        break;
        case EatFormatRg8i:         type.getQualifier().layoutFormat = ElfRg8i;         break;
        case EatFormatR16i:         type.getQualifier().layoutFormat = ElfR16i;         break;
        case EatFormatR8i:          type.getQualifier().layoutFormat = ElfR8i;          break;
        case EatFormatRgba32ui:     type.getQualifier().layoutFormat = ElfRgba32ui;     break;
        case EatFormatRgba16ui:     type.getQualifier().layoutFormat = ElfRgba16ui;     break;
        case EatFormatRgba8ui:      type.getQualifier().layoutFormat = ElfRgba8ui;      break;
        case EatFormatR32ui:        type.getQualifier().layoutFormat = ElfR32ui;        break;
        case EatFormatRgb10a2ui:    type.getQualifier().layoutFormat = ElfRgb10a2ui;    break;
        case EatFormatRg32ui:       type.getQualifier().layoutFormat = ElfRg32ui;       break;
        case EatFormatRg16ui:       type.getQualifier().layoutFormat = ElfRg16ui;       break;
        case EatFormatRg8ui:        type.getQualifier().layoutFormat = ElfRg8ui;        break;
        case EatFormatR16ui:        type.getQualifier().layoutFormat = ElfR16ui;        break;
        case EatFormatR8ui:         type.getQualifier().layoutFormat = ElfR8ui;         break;
        case EatFormatUnknown:      type.getQualifier().layoutFormat = ElfNone;         break;

        case EatNonWritable:  type.getQualifier().readonly = true;   break;
        case EatNonReadable:  type.getQualifier().writeonly = true;  break;

        default:
            if (! allowEntry)
                warn(loc, "attribute does not apply to a type", "", "");
            break;
        }
    }
}